

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall FileTokenizer::loadToken(Token *__return_storage_ptr__,FileTokenizer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  bool bVar8;
  char32_t cVar9;
  int iVar10;
  uint uVar11;
  ulong uVar13;
  pointer pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int __c;
  char cVar15;
  long lVar16;
  string *source;
  size_t sVar17;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  _Alloc_hider _Var20;
  ulong uVar21;
  string text;
  double value_1;
  uint local_ac;
  ulong local_98;
  uint local_8c;
  string local_88;
  uint local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  string *local_38;
  ulong uVar12;
  
  if (((this->currentLine)._M_string_length <= this->linePos) &&
     (bVar7 = TextFile::atEnd(this->input), bVar7)) {
    createToken(this,Invalid,0);
LAB_0014d171:
    *(undefined8 *)((long)&__return_storage_ptr__->column + 5) =
         *(undefined8 *)((long)&(this->token).column + 5);
    sVar17 = (this->token).column;
    __return_storage_ptr__->line = (this->token).line;
    __return_storage_ptr__->column = sVar17;
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Move_ctor_base
              ((_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &__return_storage_ptr__->value,
               (_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &(this->token).value);
    paVar1 = &(__return_storage_ptr__->originalText).field_2;
    (__return_storage_ptr__->originalText)._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (this->token).originalText._M_dataplus._M_p;
    paVar6 = &(this->token).originalText.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar6) {
      uVar4 = *(undefined8 *)((long)&(this->token).originalText.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->originalText).field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->originalText)._M_dataplus._M_p = pcVar3;
      (__return_storage_ptr__->originalText).field_2._M_allocated_capacity =
           paVar6->_M_allocated_capacity;
    }
    (__return_storage_ptr__->originalText)._M_string_length =
         (this->token).originalText._M_string_length;
    (this->token).originalText._M_dataplus._M_p = (pointer)paVar6;
    (this->token).originalText._M_string_length = 0;
    (this->token).originalText.field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  uVar21 = this->linePos;
  local_98 = uVar21;
  if (this->equActive == true) {
    uVar18 = (this->currentLine)._M_string_length;
    if (uVar21 < uVar18) {
      pcVar3 = (this->currentLine)._M_dataplus._M_p;
      uVar13 = uVar21;
      do {
        local_98 = uVar13;
        if ((pcVar3[uVar13] == ';') ||
           (((uVar12 = uVar13 + 1, uVar12 < uVar18 && (pcVar3[uVar13] == '/')) &&
            (pcVar3[uVar13 + 1] == '/')))) break;
        uVar13 = uVar12;
        local_98 = uVar18;
      } while (uVar18 != uVar12);
    }
    createTokenCurrentString(this,EquValue,local_98 - uVar21);
    this->equActive = false;
    goto LAB_0014d171;
  }
  bVar7 = parseOperator(this);
  if (bVar7) goto LAB_0014d171;
  source = &this->currentLine;
  pcVar3 = (this->currentLine)._M_dataplus._M_p;
  cVar15 = pcVar3[uVar21];
  if (cVar15 == '\"') {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    uVar21 = uVar21 + 1;
    uVar18 = (this->currentLine)._M_string_length;
    if (uVar21 < uVar18) {
      uVar13 = uVar21;
      local_98 = uVar21;
      do {
        uVar21 = uVar13 + 1;
        cVar15 = (char)&local_88;
        if ((uVar21 < uVar18) && (pcVar3 = (source->_M_dataplus)._M_p, pcVar3[uVar13] == '\\')) {
          cVar2 = pcVar3[uVar21];
          if (cVar2 == '\\') {
            std::__cxx11::string::push_back(cVar15);
          }
          else {
            if (cVar2 != '\"') goto LAB_0014d26c;
            std::__cxx11::string::push_back(cVar15);
          }
          uVar21 = uVar13 + 2;
        }
        else {
LAB_0014d26c:
          if ((source->_M_dataplus)._M_p[uVar13] == '\"') {
            local_98 = uVar21;
            createToken(this,String,uVar21 - this->linePos,&local_88,0,local_88._M_string_length);
            Token::Token(__return_storage_ptr__,&this->token);
            goto LAB_0014d723;
          }
          std::__cxx11::string::push_back(cVar15);
        }
        uVar18 = (this->currentLine)._M_string_length;
        uVar13 = uVar21;
      } while (uVar21 < uVar18);
    }
    sVar17 = this->linePos;
    local_98 = uVar21;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Unexpected end of line in string constant","");
    createToken(this,Invalid,uVar21 - sVar17,&local_58,0,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    *(undefined8 *)((long)&__return_storage_ptr__->column + 5) =
         *(undefined8 *)((long)&(this->token).column + 5);
    sVar17 = (this->token).column;
    __return_storage_ptr__->line = (this->token).line;
    __return_storage_ptr__->column = sVar17;
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Move_ctor_base
              ((_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &__return_storage_ptr__->value,
               (_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &(this->token).value);
    paVar1 = &(__return_storage_ptr__->originalText).field_2;
    (__return_storage_ptr__->originalText)._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (this->token).originalText._M_dataplus._M_p;
    paVar6 = &(this->token).originalText.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar6) {
      uVar4 = *(undefined8 *)((long)&(this->token).originalText.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->originalText).field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->originalText)._M_dataplus._M_p = pcVar3;
      (__return_storage_ptr__->originalText).field_2._M_allocated_capacity =
           paVar6->_M_allocated_capacity;
    }
    (__return_storage_ptr__->originalText)._M_string_length =
         (this->token).originalText._M_string_length;
    (this->token).originalText._M_dataplus._M_p = (pointer)paVar6;
    (this->token).originalText._M_string_length = 0;
    (this->token).originalText.field_2._M_local_buf[0] = '\0';
LAB_0014d723:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0014d951;
  }
  if (cVar15 == '\'') {
    local_88._M_dataplus._M_p = (pointer)(uVar21 + 1);
    cVar9 = anon_unknown.dwarf_187963::decodeUtf8Character(source,(size_t *)&local_88);
    if (local_88._M_dataplus._M_p[(long)pcVar3] == '\'') {
      createToken(this,Integer,(size_t)(local_88._M_dataplus._M_p + (1 - uVar21)),(ulong)(uint)cVar9
                 );
      goto LAB_0014d171;
    }
  }
  if ((byte)(cVar15 - 0x30U) < 10) {
    uVar18 = uVar21 + 1;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->currentLine)._M_string_length;
    pcVar14 = (pointer)CONCAT71((int7)((ulong)local_60 >> 8),local_60 <= uVar18);
    if (cVar15 != '0' || local_60 <= uVar18) {
      local_8c = 0;
    }
    else {
      pcVar14 = pcVar3;
      iVar10 = tolower((int)pcVar3[uVar18]);
      local_8c = CONCAT31((int3)((uint)iVar10 >> 8),iVar10 == 0x78);
    }
    uVar18 = uVar21;
    if (uVar21 < local_60) {
      bVar8 = true;
      bVar7 = false;
      local_ac = 0;
      local_64 = 0;
      local_38 = source;
      do {
        cVar15 = pcVar3[uVar18];
        __c = (int)cVar15;
        iVar10 = isalnum(__c);
        if ((__c != 0x2e) && (source = local_38, iVar10 == 0)) break;
        if (cVar15 == '.') {
          if (((local_ac & 1) != 0) || (bVar7)) {
            bVar7 = true;
            bVar8 = false;
          }
          else {
            bVar7 = true;
          }
        }
        else {
          iVar10 = tolower(__c);
          if (iVar10 == 0x65) {
            if ((local_8c & 1) == 0) {
              if ((local_ac & 1) == 0) {
                uVar13 = uVar18 + 1;
                if (uVar13 < local_60) {
                  uVar12 = 0;
                  if ((pcVar3[uVar13] != '-') && (pcVar3[uVar13] != '+')) {
                    local_ac = 1;
                    goto LAB_0014d562;
                  }
                  if (uVar18 + 2 < local_60) {
                    uVar11 = isalnum((int)pcVar3[uVar18 + 2]);
                    uVar12 = (ulong)uVar11;
                    pcVar14 = (pointer)CONCAT71((int7)((ulong)pcVar14 >> 8),1);
                    local_64 = (uint)pcVar14;
                    if (uVar11 == 0) goto LAB_0014d5b7;
                  }
                  else {
LAB_0014d5b7:
                    local_64 = (uint)CONCAT71((int7)(uVar12 >> 8),1);
                    bVar8 = false;
                  }
                  local_ac = 1;
                  uVar18 = uVar13;
                  goto LAB_0014d562;
                }
              }
              else {
                bVar8 = false;
              }
              pcVar14 = (pointer)CONCAT71((int7)((ulong)pcVar14 >> 8),1);
              local_ac = (uint)pcVar14;
            }
          }
          else if ((iVar10 == 0x68) && ((local_64 & 1) == 0)) {
            local_8c = 1;
          }
        }
LAB_0014d562:
        uVar18 = uVar18 + 1;
        source = local_38;
      } while (uVar18 < local_60);
    }
    else {
      bVar8 = true;
      local_ac._0_1_ = 0;
      bVar7 = false;
    }
    if ((bVar7) || (((byte)local_ac & ((byte)local_8c ^ 1)) != 0)) {
      if (bVar8) {
        bVar7 = convertFloat(this,uVar21,uVar18,(double *)&local_58);
        if (bVar7) {
          createToken(this,Float,uVar18 - uVar21,(double)local_58._M_dataplus._M_p);
        }
        else {
          createTokenCurrentString(this,NumberString,uVar18 - uVar21);
        }
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Invalid floating point number","");
        createToken(this,Invalid,uVar18 - uVar21,&local_88,0,local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    else {
      bVar7 = stringToInt(source,uVar21,uVar18,(int64_t *)&local_88);
      if (!bVar7) {
        createTokenCurrentString(this,NumberString,uVar18 - uVar21);
        Token::Token(__return_storage_ptr__,&this->token);
        return __return_storage_ptr__;
      }
      createToken(this,Integer,uVar18 - uVar21,(int64_t)local_88._M_dataplus._M_p);
    }
    Token::Token(__return_storage_ptr__,&this->token);
    return __return_storage_ptr__;
  }
  uVar21 = local_98;
  if (local_98 < (this->currentLine)._M_string_length) {
    bVar7 = true;
    do {
      bVar7 = SymbolTable::isValidSymbolCharacter((source->_M_dataplus)._M_p[uVar21],bVar7);
      if (!bVar7) break;
      uVar21 = uVar21 + 1;
      bVar7 = false;
    } while (uVar21 < (this->currentLine)._M_string_length);
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (uVar21 - this->linePos);
  local_98 = uVar21;
  if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    cVar9 = anon_unknown.dwarf_187963::decodeUtf8Character(source,&local_98);
    convertUnicodeCharToUtf8_abi_cxx11_(&local_58,cVar9);
    tinyformat::format<std::__cxx11::string>
              (&local_88,(tinyformat *)"Invalid input \'%s\'",(char *)&local_58,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    createToken(this,Invalid,local_98 - uVar21,&local_88,0,local_88._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)source);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_88._M_dataplus._M_p + local_88._M_string_length);
    _Var20._M_p = local_88._M_dataplus._M_p;
    if (0 < (long)local_88._M_string_length >> 2) {
      lVar16 = ((long)local_88._M_string_length >> 2) + 1;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_88._M_dataplus._M_p + 3);
      do {
        paVar19 = paVar6;
        iVar10 = iswupper((int)paVar19->_M_local_buf[-3]);
        if (iVar10 != 0) {
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar19->_M_local_buf + -3);
          goto LAB_0014d887;
        }
        iVar10 = iswupper((int)paVar19->_M_local_buf[-2]);
        if (iVar10 != 0) {
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar19->_M_local_buf + -2);
          goto LAB_0014d887;
        }
        iVar10 = iswupper((int)paVar19->_M_local_buf[-1]);
        if (iVar10 != 0) {
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar19->_M_local_buf + -1);
          goto LAB_0014d887;
        }
        iVar10 = iswupper((int)paVar19->_M_local_buf[0]);
        local_60 = paVar19;
        if (iVar10 != 0) goto LAB_0014d887;
        lVar16 = lVar16 + -1;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar19->_M_local_buf + 4);
      } while (1 < lVar16);
      _Var20._M_p = paVar19->_M_local_buf + 1;
    }
    lVar16 = (long)paVar1 - (long)_Var20._M_p;
    if (lVar16 == 1) {
LAB_0014d6b6:
      iVar10 = iswupper((int)*_Var20._M_p);
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var20._M_p;
      if (iVar10 == 0) {
        local_60 = paVar1;
      }
    }
    else if (lVar16 == 2) {
LAB_0014d6a6:
      iVar10 = iswupper((int)*_Var20._M_p);
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var20._M_p;
      if (iVar10 == 0) {
        _Var20._M_p = _Var20._M_p + 1;
        goto LAB_0014d6b6;
      }
    }
    else {
      local_60 = paVar1;
      if ((lVar16 == 3) &&
         (iVar10 = iswupper((int)*_Var20._M_p),
         local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var20._M_p, iVar10 == 0)) {
        _Var20._M_p = _Var20._M_p + 1;
        goto LAB_0014d6a6;
      }
    }
LAB_0014d887:
    sVar5 = local_88._M_string_length;
    _Var20._M_p = local_88._M_dataplus._M_p;
    if ((local_60 != paVar1) && (local_88._M_string_length != 0)) {
      sVar17 = 0;
      do {
        iVar10 = tolower((int)_Var20._M_p[sVar17]);
        _Var20._M_p[sVar17] = (char)iVar10;
        sVar17 = sVar17 + 1;
      } while (sVar5 != sVar17);
    }
    iVar10 = std::__cxx11::string::compare((char *)&local_88);
    sVar17 = uVar21 - this->linePos;
    if (iVar10 == 0) {
      createToken(this,Equ,sVar17);
      this->equActive = true;
    }
    else if (local_60 == paVar1) {
      createTokenCurrentString(this,Identifier,sVar17);
    }
    else {
      createToken(this,Identifier,sVar17,&local_88,0,local_88._M_string_length);
    }
  }
  Token::Token(__return_storage_ptr__,&this->token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    return __return_storage_ptr__;
  }
LAB_0014d951:
  operator_delete(local_88._M_dataplus._M_p,
                  CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                           local_88.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

Token FileTokenizer::loadToken()
{
	if (isInputAtEnd())
	{
		createToken(TokenType::Invalid,0);
		return std::move(token);
	}

	size_t pos = linePos;

	if (equActive)
	{
		while (pos < currentLine.size() && !isComment(currentLine,pos))
			pos++;

		createTokenCurrentString(TokenType::EquValue,pos-linePos);

		equActive = false;
		return std::move(token);
	}

	if (parseOperator())
		return std::move(token);

	char first = currentLine[pos];

	// character constants
	if (first == '\'')
	{
		size_t decodePos = pos+1;

		auto value = int64_t(decodeUtf8Character(currentLine, decodePos));
		if (currentLine[decodePos] == '\'')
		{
			createToken(TokenType::Integer,decodePos+1-pos,value);
			return std::move(token);
		}
	}

	// strings
	if (first == '"')
	{
		std::string text;
		pos++;

		bool valid = false;
		while (pos < currentLine.size())
		{
			if (pos+1 < currentLine.size() && currentLine[pos] == '\\')
			{
				if (currentLine[pos+1] == '"')
				{
					text += '"';
					pos += 2;
					continue;
				}
				
				if (currentLine[pos+1] == '\\')
				{
					text += '\\';
					pos += 2;
					continue;
				}
			}

			if (currentLine[pos] == '"')
			{
				pos++;
				valid = true;
				break;
			}

			text += currentLine[pos++];
		}

		if (!valid)
		{
			createToken(TokenType::Invalid,pos-linePos, "Unexpected end of line in string constant");
			return std::move(token);
		}
		
		createToken(TokenType::String,pos-linePos,text);
		return std::move(token);
	}

	// numbers
	if (first >= '0' && first <= '9')
	{
		// find end of number
		size_t start = pos;
		size_t end = pos;
		bool isValid = true;
		bool foundPoint = false;
		bool foundExp = false;
		bool foundExpSign = false;
		bool isHex = start+1 < currentLine.size() && currentLine[start] == '0' && tolower(currentLine[start+1]) == 'x';

		while (end < currentLine.size() && (isalnum(currentLine[end]) || currentLine[end] == '.'))
		{
			if (currentLine[end] == '.')
			{
				if (foundExp || foundPoint)
					isValid = false;
				foundPoint = true;
			} else if (tolower(currentLine[end]) == 'h' && !foundExpSign) {
				isHex = true;
			} else if (tolower(currentLine[end]) == 'e' && !isHex)
			{
				if (foundExp)
				{
					isValid = false;
				} else if (end+1 < currentLine.size() && (currentLine[end+1] == '+' || currentLine[end+1] == '-')){
					end++;
					if (end+1 >= currentLine.size() || !isalnum(currentLine[end+1]))
						isValid = false;
					foundExpSign = true;
				}
				foundExp = true;
			}

			end++;
		}

		bool isFloat = foundPoint || (foundExp && !isHex);

		if (!isFloat)
		{
			int64_t value;
			if (!convertInteger(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Integer,end-start,value);
		} else { // isFloat
			double value;
			if (!isValid)
			{
				createToken(TokenType::Invalid,end-start, "Invalid floating point number");
				return std::move(token);
			}

			if (!convertFloat(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Float,end-start,value);
		}
		
		return std::move(token);
	}

	// identifiers
	bool isFirst = true;
	while (pos < currentLine.size() && Global.symbolTable.isValidSymbolCharacter(currentLine[pos],isFirst))
	{
		pos++;
		isFirst = false;
	}

	if (pos == linePos)
	{
		auto characterStart = pos;
		auto value = decodeUtf8Character(currentLine, pos);
		std::string text = tfm::format("Invalid input '%s'",convertUnicodeCharToUtf8(value));
		createToken(TokenType::Invalid,pos-characterStart,text);
		return std::move(token);
	}

	std::string text = currentLine.substr(linePos,pos-linePos);
	bool textLowered = false;
	// Lowercase is common, let's try to avoid a copy.
	if (std::any_of(text.begin(), text.end(), ::iswupper))
	{
		std::transform(text.begin(), text.end(), text.begin(), ::tolower);
		textLowered = true;
	}

	if (text == "equ")
	{
		createToken(TokenType::Equ,pos-linePos);
		equActive = true;
	} else if (textLowered) {
		createToken(TokenType::Identifier,pos-linePos,text);
	} else {
		createTokenCurrentString(TokenType::Identifier,pos-linePos);
	}

	return std::move(token);
}